

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2.c
# Opt level: O0

void olsrv2_generate_tcs(_Bool generate)

{
  uint64_t local_38;
  uint64_t interval;
  _Bool generate_local;
  
  local_38 = _overwrite_tc_interval;
  if (_overwrite_tc_interval == 0) {
    local_38 = _olsrv2_config.tc_interval;
  }
  if ((generate) && (_tc_timer._clock == 0)) {
    oonf_timer_set_ext(&_tc_timer,local_38,local_38);
  }
  else if ((!generate) && (_tc_timer._clock != 0)) {
    oonf_timer_stop(&_tc_timer);
  }
  return;
}

Assistant:

void
olsrv2_generate_tcs(bool generate) {
  uint64_t interval;

  interval = _overwrite_tc_interval;
  if (!interval) {
    interval = _olsrv2_config.tc_interval;
  }
  if (generate && !oonf_timer_is_active(&_tc_timer)) {
    oonf_timer_set(&_tc_timer, interval);
  }
  else if (!generate && oonf_timer_is_active(&_tc_timer)) {
    oonf_timer_stop(&_tc_timer);
  }
}